

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

string * __thiscall CInv::ToString_abi_cxx11_(string *__return_storage_ptr__,CInv *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  GetCommand_abi_cxx11_(&local_48,this);
  base_blob<256u>::ToString_abi_cxx11_(&local_68,&this->hash);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)"%s %s",(char *)&local_48,&local_68,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CInv::ToString() const
{
    try {
        return strprintf("%s %s", GetCommand(), hash.ToString());
    } catch(const std::out_of_range &) {
        return strprintf("0x%08x %s", type, hash.ToString());
    }
}